

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexSubImage2DParamsCase::createTexture(TexSubImage2DParamsCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TransferFormat TVar5;
  uint rowPitch;
  int iVar6;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  PixelBufferAccess local_b0;
  Vec4 colorB;
  Vec4 cBias;
  Vec4 cScale;
  Vec4 colorA;
  Vector<float,_4> local_48;
  
  this_01 = &(this->super_Texture2DSpecCase).m_texFormat;
  TVar5 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  iVar4 = tcu::TextureFormat::getPixelSize(this_01);
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)(((this->super_Texture2DSpecCase).m_width * iVar4 + 3U & 0xfffffffc) *
                              (this->super_Texture2DSpecCase).m_height));
  iVar6 = (this->super_Texture2DSpecCase).m_width;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_b0,this_01,iVar6,(this->super_Texture2DSpecCase).m_height,1,
             iVar6 * iVar4 + 3U & 0xfffffffc,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  minVal = &(this->super_Texture2DSpecCase).m_texFormatInfo;
  maxVal = &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax;
  tcu::fillWithComponentGradients(&local_b0,&minVal->valueMin,maxVal);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,
             (this->super_Texture2DSpecCase).m_width,(this->super_Texture2DSpecCase).m_height,0,
             TVar5.format,TVar5.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = this->m_rowLength;
  iVar1 = this->m_skipRows;
  if (iVar6 < 1) {
    iVar6 = this->m_subW;
  }
  iVar2 = this->m_alignment;
  iVar3 = this->m_subH;
  tcu::operator-((tcu *)&cScale,maxVal,&minVal->valueMin);
  tcu::Vector<float,_4>::Vector(&cBias,&minVal->valueMin);
  colorB.m_data[0] = 1.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_b0,&colorB,&cScale);
  tcu::operator+((tcu *)&colorA,(Vector<float,_4> *)&local_b0,&cBias);
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_b0,&local_48,&cScale);
  tcu::operator+((tcu *)&colorB,(Vector<float,_4> *)&local_b0,&cBias);
  rowPitch = -iVar2 & (iVar6 * iVar4 + iVar2) - 1U;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((iVar1 + iVar3) * rowPitch));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_b0,this_01,this->m_subW,this->m_subH,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)(this->m_skipPixels * iVar4) + (long)(int)(this->m_skipRows * rowPitch));
  tcu::fillWithGrid(&local_b0,4,&colorA,&colorB);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glTexSubImage2D
            (this_00,0xde1,0,this->m_subX,this->m_subY,this->m_subW,this->m_subH,TVar5.format,
             TVar5.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		// First fill texture with gradient.
		data.resize(deAlign32(m_width*pixelSize, 4)*m_height);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, deAlign32(m_width*pixelSize, 4), 0, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength	= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
			int		height		= m_subH + m_skipRows;
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(rowPitch*height);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize), 4, colorA, colorB);
		}

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage2D(GL_TEXTURE_2D, 0, m_subX, m_subY, m_subW, m_subH, transferFmt.format, transferFmt.dataType, &data[0]);
	}